

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

void __thiscall
TPZMatrix<Fad<double>_>::SolveJacobi
          (TPZMatrix<Fad<double>_> *this,int64_t *numiterations,TPZFMatrix<Fad<double>_> *F,
          TPZFMatrix<Fad<double>_> *result,TPZFMatrix<Fad<double>_> *residual,
          TPZFMatrix<Fad<double>_> *scratch,REAL *tol,int FromCurrent)

{
  long lVar1;
  int64_t iVar2;
  Fad<double> *this_00;
  long *in_RCX;
  TPZBaseMatrix *in_RDX;
  long *in_RSI;
  long *in_RDI;
  TPZFMatrix<Fad<double>_> *in_R8;
  TPZFMatrix<Fad<double>_> *in_R9;
  double dVar3;
  double *in_stack_00000008;
  int in_stack_00000010;
  int64_t i;
  int64_t ic;
  int64_t it;
  int64_t c;
  int64_t r;
  REAL res;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 uVar4;
  TPZFMatrix<Fad<double>_> *in_stack_ffffffffffffff60;
  FadExpr<FadBinaryDiv<Fad<double>,_Fad<double>_>_> *in_stack_ffffffffffffff68;
  Fad<double> *in_stack_ffffffffffffff70;
  Fad<double> *in_stack_ffffffffffffff78;
  TPZFMatrix<Fad<double>_> *in_stack_ffffffffffffffa0;
  long local_58;
  long local_50;
  double local_38;
  
  if (in_stack_00000010 == 0) {
    TPZFMatrix<Fad<double>_>::operator=(in_R8,in_R9);
    (**(code **)(*in_RCX + 0x78))();
  }
  else {
    (**(code **)(*in_RDI + 0x140))(in_RDI,in_RCX,in_RDX,in_R9);
  }
  dVar3 = ::Norm(in_stack_ffffffffffffffa0);
  local_38 = TPZExtractVal::val(dVar3);
  lVar1 = (**(code **)(*in_RDI + 0x60))();
  iVar2 = TPZBaseMatrix::Cols(in_RDX);
  local_50 = 0;
  while( true ) {
    uVar4 = false;
    if (local_50 < *in_RSI) {
      uVar4 = *in_stack_00000008 <= ABS(local_38) && ABS(local_38) != *in_stack_00000008;
    }
    if ((bool)uVar4 == false) break;
    for (local_58 = 0; local_58 < iVar2; local_58 = local_58 + 1) {
      for (in_stack_ffffffffffffffa0 = (TPZFMatrix<Fad<double>_> *)0x0;
          (long)in_stack_ffffffffffffffa0 < lVar1;
          in_stack_ffffffffffffffa0 =
               (TPZFMatrix<Fad<double>_> *)
               ((long)&(in_stack_ffffffffffffffa0->super_TPZMatrix<Fad<double>_>).
                       super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable + 1)) {
        this_00 = TPZFMatrix<Fad<double>_>::operator()
                            (in_stack_ffffffffffffff60,(int64_t)in_RDI,
                             CONCAT17(uVar4,in_stack_ffffffffffffff50));
        (**(code **)(*in_RDI + 0x120))(&stack0xffffffffffffff70,in_RDI,in_stack_ffffffffffffffa0);
        operator/<Fad<double>,_Fad<double>,_nullptr>
                  (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
        TPZFMatrix<Fad<double>_>::operator()
                  (in_stack_ffffffffffffff60,(int64_t)in_RDI,
                   CONCAT17(uVar4,in_stack_ffffffffffffff50));
        Fad<double>::operator+=(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
        FadExpr<FadBinaryDiv<Fad<double>,_Fad<double>_>_>::~FadExpr
                  ((FadExpr<FadBinaryDiv<Fad<double>,_Fad<double>_>_> *)this_00);
        Fad<double>::~Fad(this_00);
      }
    }
    (**(code **)(*in_RDI + 0x140))(in_RDI,in_RCX,in_RDX,in_R9);
    dVar3 = ::Norm(in_stack_ffffffffffffffa0);
    local_38 = TPZExtractVal::val(dVar3);
    local_50 = local_50 + 1;
  }
  if (in_R8 != (TPZFMatrix<Fad<double>_> *)0x0) {
    TPZFMatrix<Fad<double>_>::operator=(in_R8,in_R9);
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::SolveJacobi(int64_t &numiterations,const TPZFMatrix<TVar> &F, TPZFMatrix<TVar> &result,
								  TPZFMatrix<TVar> *residual, TPZFMatrix<TVar> &scratch, REAL &tol,const int FromCurrent) {
	
	
	if(FromCurrent) {
		Residual(result,F,scratch);
	} else {
		scratch = F;
		result.Zero();
	}
	REAL res;
	res = TPZExtractVal::val(Norm(scratch));
	int64_t r = Dim();
	int64_t c = F.Cols();
	for(int64_t it=0; it<numiterations && (fabs(res)) > tol; it++) {
		for(int64_t ic=0; ic<c; ic++) {
			for(int64_t i=0; i<r; i++) {
				result(i,ic) += (scratch)(i,ic)/GetVal(i,i);
			}
		}
		Residual(result,F,scratch);
		res = TPZExtractVal::val(Norm(scratch));
	}
	if(residual) *residual = scratch;
}